

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
evaluator<Eigen::Diagonal<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>_>
::evaluator(evaluator<Eigen::Diagonal<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>_>
            *this,XprType *diagonal)

{
  type *xpr;
  char *v;
  int __c;
  XprType *diagonal_local;
  evaluator<Eigen::Diagonal<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>_>
  *this_local;
  
  evaluator_base<Eigen::Diagonal<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>_>
  ::evaluator_base((evaluator_base<Eigen::Diagonal<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>_>
                    *)this);
  xpr = Diagonal<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>
        ::nestedExpression(diagonal);
  evaluator<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
  ::evaluator(&this->m_argImpl,xpr);
  v = Diagonal<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>
      ::index(diagonal,(char *)xpr,__c);
  variable_if_dynamicindex<long,_0>::variable_if_dynamicindex
            ((variable_if_dynamicindex<long,_0> *)&this->field_0x10,(long)v);
  return;
}

Assistant:

explicit evaluator(const XprType& diagonal)
    : m_argImpl(diagonal.nestedExpression()),
      m_index(diagonal.index())
  { }